

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_promise_finally(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  JSValue v;
  JSValue v_00;
  int iVar3;
  ulong uVar4;
  int64_t iVar5;
  int64_t *piVar6;
  JSRefCountHeader *p;
  long lVar7;
  JSValue JVar8;
  JSValue JVar9;
  JSValue JVar10;
  JSValueUnion local_88;
  int64_t local_80;
  JSValueUnion local_78;
  int64_t local_70;
  int64_t local_68;
  JSValueUnion local_60;
  JSValue local_58;
  JSValueUnion local_48;
  int64_t local_40;
  
  iVar5 = this_val.tag;
  local_60 = this_val.u;
  JVar1 = (JSValueUnion)(argv->u).ptr;
  iVar2 = argv->tag;
  JVar9 = *argv;
  JVar8 = JS_SpeciesConstructor(ctx,this_val,(JSValue)(ZEXT816(3) << 0x40));
  if ((int)JVar8.tag == 6) {
    uVar4 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
  }
  else {
    iVar3 = JS_IsFunction(ctx,JVar9);
    local_68 = iVar5;
    if (iVar3 == 0) {
      local_88 = JVar1;
      local_80 = iVar2;
      local_78 = JVar1;
      local_70 = iVar2;
      if (0xfffffff4 < (uint)iVar2) {
        *(int *)JVar1.ptr = *JVar1.ptr + 1;
        *(int *)JVar1.ptr = *JVar1.ptr + 1;
      }
    }
    else {
      piVar6 = &local_80;
      local_58 = JVar8;
      local_48 = JVar1;
      local_40 = iVar2;
      for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
        JVar9 = JS_NewCFunctionData(ctx,js_promise_then_finally_func,1,(int)lVar7,2,&local_58);
        *(JSValueUnion *)(piVar6 + -1) = JVar9.u;
        *piVar6 = JVar9.tag;
        if ((int)JVar9.tag == 6) {
          if (lVar7 == 1) {
            JVar9.tag = local_80;
            JVar9.u.ptr = local_88.ptr;
            JS_FreeValue(ctx,JVar9);
          }
          JS_FreeValue(ctx,JVar8);
          JVar8 = (JSValue)(ZEXT816(6) << 0x40);
          uVar4 = 0;
          goto LAB_0013d1e9;
        }
        piVar6 = piVar6 + 2;
      }
    }
    JS_FreeValue(ctx,JVar8);
    JVar8.tag = local_68;
    JVar8.u.float64 = local_60.float64;
    JVar8 = JS_Invoke(ctx,JVar8,0x7f,2,(JSValue *)&local_88);
    v.tag = local_80;
    v.u.float64 = local_88.float64;
    JS_FreeValue(ctx,v);
    v_00.tag = local_70;
    v_00.u.float64 = local_78.float64;
    JS_FreeValue(ctx,v_00);
    uVar4 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
  }
LAB_0013d1e9:
  JVar10.u.ptr = (void *)((ulong)JVar8.u.ptr & 0xffffffff | uVar4);
  JVar10.tag = JVar8.tag;
  return JVar10;
}

Assistant:

static JSValue js_promise_finally(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValueConst onFinally = argv[0];
    JSValue ctor, ret;
    JSValue then_funcs[2];
    JSValueConst func_data[2];
    int i;

    ctor = JS_SpeciesConstructor(ctx, this_val, JS_UNDEFINED);
    if (JS_IsException(ctor))
        return ctor;
    if (!JS_IsFunction(ctx, onFinally)) {
        then_funcs[0] = JS_DupValue(ctx, onFinally);
        then_funcs[1] = JS_DupValue(ctx, onFinally);
    } else {
        func_data[0] = ctor;
        func_data[1] = onFinally;
        for(i = 0; i < 2; i++) {
            then_funcs[i] = JS_NewCFunctionData(ctx, js_promise_then_finally_func, 1, i, 2, func_data);
            if (JS_IsException(then_funcs[i])) {
                if (i == 1)
                    JS_FreeValue(ctx, then_funcs[0]);
                JS_FreeValue(ctx, ctor);
                return JS_EXCEPTION;
            }
        }
    }
    JS_FreeValue(ctx, ctor);
    ret = JS_Invoke(ctx, this_val, JS_ATOM_then, 2, (JSValueConst *)then_funcs);
    JS_FreeValue(ctx, then_funcs[0]);
    JS_FreeValue(ctx, then_funcs[1]);
    return ret;
}